

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t next_id,
          BlockSet *inside,BlockSet *previous_inside,Op opcode,bool reverse_cfg)

{
  BlockSet *this_00;
  byte bVar1;
  uint32_t uVar2;
  size_type sVar3;
  CFG *this_01;
  BasicBlock *block_00;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_02;
  IRContext *c;
  Instruction *pos;
  bool bVar4;
  undefined1 local_b8 [16];
  Instruction *inst;
  BasicBlock *new_branch;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  auStack_98 [56];
  function<void_(unsigned_int)> local_60;
  undefined1 local_3d [8];
  bool next_has_previous_inside;
  Op local_34;
  bool modified;
  bool reverse_cfg_local;
  BlockSet *pBStack_30;
  Op opcode_local;
  BlockSet *previous_inside_local;
  BlockSet *inside_local;
  BasicBlock *pBStack_18;
  uint32_t next_id_local;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  next_has_previous_inside = reverse_cfg;
  local_3d[7] = 0;
  local_34 = opcode;
  pBStack_30 = previous_inside;
  previous_inside_local = inside;
  inside_local._4_4_ = next_id;
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  sVar3 = std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)previous_inside,(key_type *)((long)&inside_local + 4));
  this_00 = previous_inside_local;
  bVar4 = false;
  if (sVar3 != 0) {
    local_3d._1_4_ = BasicBlock::id(pBStack_18);
    sVar3 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)this_00,(key_type *)(local_3d + 1));
    bVar4 = sVar3 == 0;
  }
  if (bVar4) {
    local_3d[7] = 1;
    uVar2 = BasicBlock::id(pBStack_18);
    bVar4 = hasSingleNextBlock(this,uVar2,(bool)(next_has_previous_inside & 1));
    uVar2 = inside_local._4_4_;
    if (bVar4) {
      local_3d[0] = 0;
      bVar1 = next_has_previous_inside ^ 0xff;
      new_branch = (BasicBlock *)local_3d;
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set(auStack_98,previous_inside_local);
      std::function<void(unsigned_int)>::
      function<spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge(spvtools::opt::BasicBlock*,unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,spv::Op,bool)::__0,void>
                ((function<void(unsigned_int)> *)&local_60,(anon_class_64_2_add74762 *)&new_branch);
      forEachNext(this,uVar2,(bool)(bVar1 & 1),&local_60);
      std::function<void_(unsigned_int)>::~function(&local_60);
      placeInstructionsForEdge(spvtools::opt::BasicBlock*,unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>&,spv::Op,bool)
      ::$_0::~__0((__0 *)&new_branch);
      if ((local_3d[0] & 1) == 0) {
        __assert_fail("next_has_previous_inside && \"`previous_inside` must be the set of blocks with at least one \" \"previous block in `inside`\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                      ,0x16a,
                      "bool spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge(BasicBlock *, uint32_t, BlockSet &, BlockSet &, spv::Op, bool)"
                     );
      }
      addInstructionAtBlockBoundary(this,pBStack_18,local_34,(bool)(next_has_previous_inside & 1));
    }
    else {
      if ((next_has_previous_inside & 1U) == 0) {
        this_01 = Pass::cfg(&this->super_Pass);
        block_00 = CFG::block(this_01,inside_local._4_4_);
        uVar2 = BasicBlock::id(pBStack_18);
        inst = (Instruction *)splitEdge(this,block_00,uVar2);
      }
      else {
        inst = (Instruction *)splitEdge(this,pBStack_18,inside_local._4_4_);
      }
      this_02.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            )::operator_new(0x70);
      c = Pass::context(&this->super_Pass);
      opt::Instruction::Instruction
                ((Instruction *)
                 this_02.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,c,local_34
                );
      local_b8._8_8_ =
           this_02.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      BasicBlock::tail((BasicBlock *)local_b8);
      pos = utils::IntrusiveList<spvtools::opt::Instruction>::
            iterator_template<spvtools::opt::Instruction>::operator*
                      ((iterator_template<spvtools::opt::Instruction> *)local_b8);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                 this_02.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pos);
    }
  }
  return (bool)(local_3d[7] & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructionsForEdge(
    BasicBlock* block, uint32_t next_id, BlockSet& inside,
    BlockSet& previous_inside, spv::Op opcode, bool reverse_cfg) {
  bool modified = false;

  if (previous_inside.count(next_id) && !inside.count(block->id())) {
    // This block is not in the critical section but the next has at least one
    // other previous block that is, so this block should be enter it as well.
    // We need to add begin or end instructions to the edge.

    modified = true;

    if (hasSingleNextBlock(block->id(), reverse_cfg)) {
      // This is the only next block.

      // Additionally, because `next_id` is in `previous_inside`, we know that
      // `next_id` has at least one previous block in `inside`. And because
      // 'block` is not in `inside`, that means the `next_id` has to have at
      // least one other previous block in `inside`.

      // This is solely for a debug assertion. It is essentially recomputing the
      // value of `previous_inside` to verify that it was computed correctly
      // such that the above statement is true.
      bool next_has_previous_inside = false;
      // By passing !reverse_cfg to forEachNext, we are actually iterating over
      // the previous blocks.
      forEachNext(next_id, !reverse_cfg,
                  [&next_has_previous_inside, inside](uint32_t previous_id) {
                    if (inside.count(previous_id)) {
                      next_has_previous_inside = true;
                    }
                  });
      assert(next_has_previous_inside &&
             "`previous_inside` must be the set of blocks with at least one "
             "previous block in `inside`");

      addInstructionAtBlockBoundary(block, opcode, reverse_cfg);
    } else {
      // This block has multiple next blocks. Split the edge and insert the
      // instruction in the new next block.
      BasicBlock* new_branch;
      if (reverse_cfg) {
        new_branch = splitEdge(block, next_id);
      } else {
        new_branch = splitEdge(cfg()->block(next_id), block->id());
      }

      auto inst = new Instruction(context(), opcode);
      inst->InsertBefore(&*new_branch->tail());
    }
  }

  return modified;
}